

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_cleanup_multiple_channels_in_vector(APITests *this)

{
  runtime_error *this_00;
  initializer_list<int> __l;
  allocator_type local_1d9;
  vector<int,_std::allocator<int>_> channels;
  int local_1c0;
  int local_1bc;
  long local_1b8;
  Warning w;
  
  GPIO::setwarnings(false);
  Warning::Warning(&w);
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  GPIO::setup((this->pin_data).in_b,IN,-1);
  GPIO::setup((this->pin_data).out_a,OUT,-1);
  local_1c0 = (this->pin_data).in_a;
  local_1bc = (this->pin_data).in_b;
  __l._M_len = 2;
  __l._M_array = &local_1c0;
  std::vector<int,_std::allocator<int>_>::vector(&channels,__l,&local_1d9);
  GPIO::cleanup((vector *)&channels);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1c0);
  if (local_1b8 == 0) {
    GPIO::cleanup();
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&channels.super__Vector_base<int,_std::allocator<int>_>);
    Warning::~Warning(&w);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected warning occured");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_cleanup_multiple_channels_in_vector()
    {
        GPIO::setwarnings(false);
        Warning w{};

        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::setup(pin_data.in_b, GPIO::IN);
        GPIO::setup(pin_data.out_a, GPIO::OUT);

        std::vector<int> channels = {pin_data.in_a, pin_data.in_b};
        GPIO::cleanup(channels);

        if (!w.contents().empty())
            throw std::runtime_error("Unexpected warning occured");

        GPIO::cleanup();
    }